

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

_Bool smtp_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *resp)

{
  int iVar1;
  char *local_58;
  char *p;
  curl_off_t code;
  char tmpline [6];
  anon_union_280_8_fcbf97e8_for_proto *paStack_40;
  _Bool result;
  smtp_conn *smtpc;
  int *resp_local;
  size_t len_local;
  char *line_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  paStack_40 = &conn->proto;
  code._7_1_ = 0;
  if (((((len < 4) || (*line < '0')) || ('9' < *line)) || ((line[1] < '0' || ('9' < line[1])))) ||
     ((line[2] < '0' || ('9' < line[2])))) {
    data_local._7_1_ = false;
  }
  else {
    if ((line[3] == ' ') || (len == 5)) {
      local_58 = (char *)((long)&code + 1);
      code._7_1_ = 1;
      iVar1 = 3;
      if (len == 5) {
        iVar1 = 5;
      }
      memcpy((void *)((long)&code + 1),line,(long)iVar1);
      iVar1 = 3;
      if (len == 5) {
        iVar1 = 5;
      }
      *(undefined1 *)((long)&code + (long)iVar1 + 1) = 0;
      iVar1 = 999;
      if (len == 5) {
        iVar1 = 99999;
      }
      iVar1 = Curl_str_number(&local_58,(curl_off_t *)&p,(long)iVar1);
      if (iVar1 != 0) {
        return false;
      }
      *resp = (int)p;
      if (*resp == 1) {
        *resp = 0;
      }
    }
    else if ((line[3] == '-') &&
            (((conn->proto).smtpc.state == SMTP_EHLO || ((conn->proto).smtpc.state == SMTP_COMMAND))
            )) {
      code._7_1_ = 1;
      *resp = 1;
    }
    data_local._7_1_ = (_Bool)(code._7_1_ & 1);
  }
  return data_local._7_1_;
}

Assistant:

static bool smtp_endofresp(struct Curl_easy *data, struct connectdata *conn,
                           const char *line, size_t len, int *resp)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  bool result = FALSE;
  (void)data;

  /* Nothing for us */
  if(len < 4 || !ISDIGIT(line[0]) || !ISDIGIT(line[1]) || !ISDIGIT(line[2]))
    return FALSE;

  /* Do we have a command response? This should be the response code followed
     by a space and optionally some text as per RFC-5321 and as outlined in
     Section 4. Examples of RFC-4954 but some email servers ignore this and
     only send the response code instead as per Section 4.2. */
  if(line[3] == ' ' || len == 5) {
    char tmpline[6];
    curl_off_t code;
    const char *p = tmpline;
    result = TRUE;
    memcpy(tmpline, line, (len == 5 ? 5 : 3));
    tmpline[len == 5 ? 5 : 3 ] = 0;
    if(Curl_str_number(&p, &code, len == 5 ? 99999 : 999))
      return FALSE;
    *resp = (int) code;

    /* Make sure real server never sends internal value */
    if(*resp == 1)
      *resp = 0;
  }
  /* Do we have a multiline (continuation) response? */
  else if(line[3] == '-' &&
          (smtpc->state == SMTP_EHLO || smtpc->state == SMTP_COMMAND)) {
    result = TRUE;
    *resp = 1;  /* Internal response code */
  }

  return result;
}